

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O1

bool __thiscall
duckdb::SegmentTree<duckdb::ColumnSegment,_false>::TryGetSegmentIndex
          (SegmentTree<duckdb::ColumnSegment,_false> *this,SegmentLock *l,idx_t row_number,
          idx_t *result)

{
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *this_00;
  pointer pSVar1;
  pointer pSVar2;
  ulong uVar3;
  bool bVar4;
  reference pvVar5;
  pointer pCVar6;
  ulong __n;
  ulong uVar7;
  ulong uVar8;
  
  this_00 = &this->nodes;
  if ((this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->nodes).
      super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      .
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::back(this_00);
    pvVar5 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::back(this_00);
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              (&pvVar5->node);
  }
  pSVar1 = (this->nodes).
           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->nodes).
           super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar1 == pSVar2) {
    bVar4 = false;
  }
  else {
    uVar8 = ((long)pSVar2 - (long)pSVar1 >> 4) - 1;
    uVar7 = 0;
    do {
      if (uVar8 < uVar7) {
        return uVar7 <= uVar8;
      }
      __n = uVar7 + uVar8 >> 1;
      pvVar5 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[](this_00,__n);
      uVar3 = pvVar5->row_start;
      if (row_number < uVar3) {
        uVar8 = __n - 1;
        bVar4 = true;
      }
      else {
        pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                 ::operator->(&pvVar5->node);
        if (row_number <
            (pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i + uVar3) {
          *result = __n;
          bVar4 = false;
        }
        else {
          uVar7 = __n + 1;
          bVar4 = true;
        }
      }
    } while (bVar4);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool TryGetSegmentIndex(SegmentLock &l, idx_t row_number, idx_t &result) {
		// load segments until the row number is within bounds
		while (nodes.empty() || (row_number >= (nodes.back().row_start + nodes.back().node->count))) {
			if (!LoadNextSegment(l)) {
				break;
			}
		}
		if (nodes.empty()) {
			return false;
		}
		idx_t lower = 0;
		idx_t upper = nodes.size() - 1;
		// binary search to find the node
		while (lower <= upper) {
			idx_t index = (lower + upper) / 2;
			D_ASSERT(index < nodes.size());
			auto &entry = nodes[index];
			D_ASSERT(entry.row_start == entry.node->start);
			if (row_number < entry.row_start) {
				upper = index - 1;
			} else if (row_number >= entry.row_start + entry.node->count) {
				lower = index + 1;
			} else {
				result = index;
				return true;
			}
		}
		return false;
	}